

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O2

uint uv__utf8_decode1(char **p,char *pe)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  pbVar2 = (byte *)*p;
  if (pe <= pbVar2) {
    __assert_fail("*p < pe",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/idna.c"
                  ,0x5e,"unsigned int uv__utf8_decode1(const char **, const char *)");
  }
  pbVar5 = pbVar2 + 1;
  *p = (char *)pbVar5;
  bVar1 = *pbVar2;
  uVar4 = (uint)bVar1;
  if (-1 < (char)bVar1) {
    return uVar4;
  }
  uVar3 = 0xffffffff;
  if (0xf7 < bVar1) {
    return 0xffffffff;
  }
  if ((byte *)pe == pbVar5) {
    return 0xffffffff;
  }
  if ((long)pe - (long)pbVar5 != 1) {
    if (((long)pe - (long)pbVar5 != 2) && (0xef < bVar1)) {
      *p = (char *)(pbVar2 + 2);
      uVar8 = (uint)pbVar2[1];
      pbVar5 = pbVar2 + 3;
      *p = (char *)pbVar5;
      uVar7 = (uint)pbVar2[2];
      *p = (char *)(pbVar2 + 4);
      uVar4 = (uVar4 & 7) << 0x12;
      uVar6 = 0x10000;
      goto LAB_001098c9;
    }
    if (0xdf < bVar1) {
      uVar8 = uVar4 & 0xffffff8f;
      pbVar5 = pbVar2 + 2;
      *p = (char *)pbVar5;
      uVar7 = (uint)pbVar2[1];
      *p = (char *)(pbVar2 + 3);
      uVar6 = 0x800;
      uVar4 = 0;
      goto LAB_001098c9;
    }
  }
  if (bVar1 < 0xc0) {
    return 0xffffffff;
  }
  uVar7 = bVar1 & 0xffffff9f;
  *p = (char *)(pbVar2 + 2);
  uVar8 = 0x80;
  uVar4 = 0;
  uVar6 = 0x80;
LAB_001098c9:
  if (((((uVar7 ^ uVar8 ^ (uint)*pbVar5) & 0xffffffc0) == 0x80) &&
      (uVar4 = (uVar8 & 0x3f) << 0xc | uVar4, uVar4 < 0x110000)) &&
     (uVar8 = (uVar7 & 0x3f) << 6 | *pbVar5 & 0x3f | uVar4, uVar6 <= uVar8)) {
    if (uVar8 < 0xd800) {
      uVar3 = uVar8;
    }
    if (0xdfff < uVar4) {
      uVar3 = uVar8;
    }
  }
  return uVar3;
}

Assistant:

unsigned uv__utf8_decode1(const char** p, const char* pe) {
  unsigned a;

  assert(*p < pe);

  a = (unsigned char) *(*p)++;

  if (a < 128)
    return a;  /* ASCII, common case. */

  return uv__utf8_decode1_slow(p, pe, a);
}